

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::DetectMapConflicts
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  pointer ppVar5;
  MessageOptions *pMVar6;
  string *psVar7;
  Descriptor *message_00;
  DescriptorProto *proto_00;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_Descriptor_*>_>::value,_pair<iterator,_bool>_>
  _Var8;
  bool local_351;
  bool local_301;
  bool local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  _Self local_1d8;
  _Self local_1d0;
  iterator iter_2;
  OneofDescriptor *oneof_desc;
  undefined1 local_1b8 [4];
  int i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  _Self local_178;
  _Self local_170;
  iterator iter_1;
  EnumDescriptor *enum_desc;
  undefined1 local_158 [4];
  int i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _Self local_118;
  _Self local_110;
  iterator iter;
  FieldDescriptor *field;
  undefined1 local_f8 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  _Base_ptr local_b8;
  undefined1 local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  local_a8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
  local_80;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_bool>
  result;
  Descriptor *nested;
  int local_54;
  undefined1 local_50 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  seen_types;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  seen_types._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)proto;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
         *)local_50);
  local_54 = 0;
  do {
    iVar3 = Descriptor::nested_type_count(message);
    if (iVar3 <= local_54) {
      for (field._4_4_ = 0; iVar3 = Descriptor::field_count(message), field._4_4_ < iVar3;
          field._4_4_ = field._4_4_ + 1) {
        iter._M_node = (_Base_ptr)Descriptor::field(message,field._4_4_);
        psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)iter._M_node);
        local_110._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                     *)local_50,psVar4);
        local_118._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                    *)local_50);
        bVar2 = std::operator!=(&local_110,&local_118);
        local_2b1 = false;
        if (bVar2) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->(&local_110);
          pMVar6 = Descriptor::options(ppVar5->second);
          local_2b1 = MessageOptions::map_entry(pMVar6);
        }
        if (local_2b1 != false) {
          psVar4 = Descriptor::full_name_abi_cxx11_(message);
          sVar1 = seen_types._M_t._M_impl.super__Rb_tree_header._M_node_count;
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->(&local_110);
          psVar7 = Descriptor::name_abi_cxx11_(ppVar5->second);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_158,"Expanded map entry type ",psVar7);
          std::operator+(&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_158," conflicts with an existing field.");
          AddError(this,psVar4,(Message *)sVar1,NAME,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)local_158);
        }
      }
      for (enum_desc._4_4_ = 0; iVar3 = Descriptor::enum_type_count(message),
          enum_desc._4_4_ < iVar3; enum_desc._4_4_ = enum_desc._4_4_ + 1) {
        iter_1._M_node = (_Base_ptr)Descriptor::enum_type(message,enum_desc._4_4_);
        psVar4 = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)iter_1._M_node);
        local_170._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                     *)local_50,psVar4);
        local_178._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                    *)local_50);
        bVar2 = std::operator!=(&local_170,&local_178);
        local_301 = false;
        if (bVar2) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->(&local_170);
          pMVar6 = Descriptor::options(ppVar5->second);
          local_301 = MessageOptions::map_entry(pMVar6);
        }
        if (local_301 != false) {
          psVar4 = Descriptor::full_name_abi_cxx11_(message);
          sVar1 = seen_types._M_t._M_impl.super__Rb_tree_header._M_node_count;
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->(&local_170);
          psVar7 = Descriptor::name_abi_cxx11_(ppVar5->second);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,"Expanded map entry type ",psVar7);
          std::operator+(&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8," conflicts with an existing enum type.");
          AddError(this,psVar4,(Message *)sVar1,NAME,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)local_1b8);
        }
      }
      for (oneof_desc._4_4_ = 0; iVar3 = Descriptor::oneof_decl_count(message),
          oneof_desc._4_4_ < iVar3; oneof_desc._4_4_ = oneof_desc._4_4_ + 1) {
        iter_2._M_node = (_Base_ptr)Descriptor::oneof_decl(message,oneof_desc._4_4_);
        psVar4 = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)iter_2._M_node);
        local_1d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                     *)local_50,psVar4);
        local_1d8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                    *)local_50);
        bVar2 = std::operator!=(&local_1d0,&local_1d8);
        local_351 = false;
        if (bVar2) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->(&local_1d0);
          pMVar6 = Descriptor::options(ppVar5->second);
          local_351 = MessageOptions::map_entry(pMVar6);
        }
        if (local_351 != false) {
          psVar4 = Descriptor::full_name_abi_cxx11_(message);
          sVar1 = seen_types._M_t._M_impl.super__Rb_tree_header._M_node_count;
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->(&local_1d0);
          psVar7 = Descriptor::name_abi_cxx11_(ppVar5->second);
          std::operator+(&local_218,"Expanded map entry type ",psVar7);
          std::operator+(&local_1f8,&local_218," conflicts with an existing oneof type.");
          AddError(this,psVar4,(Message *)sVar1,NAME,&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_218);
        }
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              *)local_50);
      return;
    }
    result._8_8_ = Descriptor::nested_type(message,local_54);
    psVar4 = Descriptor::name_abi_cxx11_((Descriptor *)result._8_8_);
    std::make_pair<std::__cxx11::string_const&,google::protobuf::Descriptor_const*&>
              (&local_a8,psVar4,(Descriptor **)&result.second);
    _Var8 = std::
            map<std::__cxx11::string,google::protobuf::Descriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
            ::insert<std::pair<std::__cxx11::string,google::protobuf::Descriptor_const*>>
                      ((map<std::__cxx11::string,google::protobuf::Descriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
                        *)local_50,&local_a8);
    local_b8 = (_Base_ptr)_Var8.first._M_node;
    local_b0 = _Var8.second;
    local_80._M_node = local_b8;
    result.first._M_node._0_1_ = local_b0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
    ::~pair(&local_a8);
    if (((byte)result.first._M_node & 1) == 0) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
               ::operator->(&local_80);
      pMVar6 = Descriptor::options(ppVar5->second);
      bVar2 = MessageOptions::map_entry(pMVar6);
      if (!bVar2) {
        pMVar6 = Descriptor::options((Descriptor *)result._8_8_);
        bVar2 = MessageOptions::map_entry(pMVar6);
        if (!bVar2) goto LAB_00a8437b;
      }
      psVar4 = Descriptor::full_name_abi_cxx11_(message);
      sVar1 = seen_types._M_t._M_impl.super__Rb_tree_header._M_node_count;
      psVar7 = Descriptor::name_abi_cxx11_((Descriptor *)result._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "Expanded map entry type ",psVar7);
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     " conflicts with an existing nested message type.");
      AddError(this,psVar4,(Message *)sVar1,NAME,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)local_f8);
    }
LAB_00a8437b:
    message_00 = Descriptor::nested_type(message,local_54);
    proto_00 = DescriptorProto::nested_type
                         ((DescriptorProto *)
                          seen_types._M_t._M_impl.super__Rb_tree_header._M_node_count,local_54);
    DetectMapConflicts(this,message_00,proto_00);
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::DetectMapConflicts(const Descriptor* message,
                                           const DescriptorProto& proto) {
  std::map<string, const Descriptor*> seen_types;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    const Descriptor* nested = message->nested_type(i);
    std::pair<std::map<string, const Descriptor*>::iterator, bool> result =
        seen_types.insert(std::make_pair(nested->name(), nested));
    if (!result.second) {
      if (result.first->second->options().map_entry() ||
          nested->options().map_entry()) {
        AddError(message->full_name(), proto,
                 DescriptorPool::ErrorCollector::NAME,
                 "Expanded map entry type " + nested->name() +
                 " conflicts with an existing nested message type.");
      }
    }
    // Recursively test on the nested types.
    DetectMapConflicts(message->nested_type(i), proto.nested_type(i));
  }
  // Check for conflicted field names.
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(field->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing field.");
    }
  }
  // Check for conflicted enum names.
  for (int i = 0; i < message->enum_type_count(); ++i) {
    const EnumDescriptor* enum_desc = message->enum_type(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(enum_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing enum type.");
    }
  }
  // Check for conflicted oneof names.
  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof_desc = message->oneof_decl(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(oneof_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing oneof type.");
    }
  }
}